

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O0

void __thiscall AGSSock::Pool::add(Pool *this,Socket *sock)

{
  size_type sVar1;
  __sighandler_t __handler;
  __sighandler_t extraout_RDX;
  int __sig;
  bool bVar2;
  pair<std::__detail::_Node_iterator<AGSSock::Socket_*,_true,_false>,_bool> pVar3;
  Lock local_20;
  Lock lock;
  Socket *sock_local;
  Pool *this_local;
  Lock *__x;
  
  lock.mutex_ = (Mutex *)sock;
  AGSSockAPI::Mutex::Lock::Lock(&local_20,&this->guard_);
  __x = &lock;
  pVar3 = std::
          unordered_set<AGSSock::Socket_*,_std::hash<AGSSock::Socket_*>,_std::equal_to<AGSSock::Socket_*>,_std::allocator<AGSSock::Socket_*>_>
          ::insert(&this->sockets_,(value_type *)__x);
  __sig = (int)__x;
  __handler = pVar3._8_8_;
  bVar2 = false;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    sVar1 = std::
            unordered_set<AGSSock::Socket_*,_std::hash<AGSSock::Socket_*>,_std::equal_to<AGSSock::Socket_*>,_std::allocator<AGSSock::Socket_*>_>
            ::size(&this->sockets_);
    bVar2 = sVar1 == 1;
    __handler = extraout_RDX;
  }
  if (bVar2) {
    AGSSockAPI::Thread::start(&this->thread_);
  }
  else {
    AGSSockAPI::Beacon::signal(&this->beacon_,__sig,__handler);
  }
  AGSSockAPI::Mutex::Lock::~Lock(&local_20);
  return;
}

Assistant:

void Pool::add(Socket *sock)
{
	Mutex::Lock lock(guard_);

	if (sockets_.insert(sock).second && sockets_.size() == 1)
		thread_.start();
	else
		beacon_.signal();
}